

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half_perf_test.cpp
# Opt level: O0

void perf_test_float_to_half(uint16_t *halfs,float *floats,int numentries)

{
  imath_half_bits_t iVar1;
  half hVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  long lVar8;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int64_t nnanos;
  int64_t onanos;
  int64_t oet;
  int i_1;
  int64_t ost;
  int64_t et;
  int i;
  int64_t st;
  half *halfvals;
  int local_44;
  int local_2c;
  
  iVar3 = get_ticks();
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    iVar1 = imath_float_to_half(*(float *)(in_RSI + (long)local_2c * 4));
    *(imath_half_bits_t *)(in_RDI + (long)local_2c * 2) = iVar1;
  }
  iVar4 = get_ticks();
  iVar5 = get_ticks();
  for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
    hVar2 = exptable_half_constructor(1.476728e-39);
    *(uint16_t *)(in_RDI + (long)local_44 * 2) = hVar2._h;
  }
  iVar6 = get_ticks();
  lVar7 = iVar6 - iVar5;
  lVar8 = iVar4 - iVar3;
  fprintf(_stderr,"float -> half Old: %10lld (%g ns) New: %10lld (%g ns) (%10lld)\n",
          (double)lVar7 / (double)in_EDX,(double)lVar8 / (double)in_EDX,lVar7,lVar8,lVar7 - lVar8);
  return;
}

Assistant:

void
perf_test_float_to_half (uint16_t* halfs, const float* floats, int numentries)
{
    half* halfvals = reinterpret_cast<half*> (halfs);

    int64_t st = get_ticks ();
    for (int i = 0; i < numentries; ++i)
        halfs[i] = imath_float_to_half (floats[i]);
    int64_t et = get_ticks ();

    int64_t ost = get_ticks ();
    for (int i = 0; i < numentries; ++i)
        halfvals[i] = exptable_half_constructor (floats[i]);
    int64_t oet = get_ticks ();

    int64_t onanos = (oet - ost);
    int64_t nnanos = (et - st);
    fprintf (
        stderr,
        "float -> half Old: %10lld (%g ns) New: %10lld (%g ns) (%10lld)\n",
        (long long) onanos,
        (double) onanos / ((double) numentries),
        (long long) nnanos,
        (double) nnanos / ((double) numentries),
        ((long long) (onanos - nnanos)));
}